

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseGTMCoverage.cxx
# Opt level: O0

bool __thiscall cmParseGTMCoverage::LoadCoverageData(cmParseGTMCoverage *this,string *d)

{
  bool bVar1;
  unsigned_long uVar2;
  char *pcVar3;
  string local_118;
  cmAlphaNum local_f8;
  cmAlphaNum local_c8;
  undefined1 local_98 [8];
  string path;
  undefined1 local_70 [8];
  string file;
  uint i;
  size_t numf;
  Status local_30;
  Directory local_28;
  Directory dir;
  string *d_local;
  cmParseGTMCoverage *this_local;
  
  dir.Internal = (DirectoryInternals *)d;
  cmsys::Directory::Directory(&local_28);
  local_30 = cmsys::Directory::Load(&local_28,(string *)dir.Internal,(string *)0x0);
  bVar1 = cmsys::Status::operator_cast_to_bool(&local_30);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    uVar2 = cmsys::Directory::GetNumberOfFiles(&local_28);
    for (file.field_2._12_4_ = 0; (uint)file.field_2._12_4_ < uVar2;
        file.field_2._12_4_ = file.field_2._12_4_ + 1) {
      pcVar3 = cmsys::Directory::GetFile(&local_28,(ulong)(uint)file.field_2._12_4_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_70,pcVar3,(allocator<char> *)(path.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(path.field_2._M_local_buf + 0xf));
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_70,".");
      if (((!bVar1) ||
          (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_70,".."), !bVar1)) ||
         (bVar1 = cmsys::SystemTools::FileIsDirectory((string *)local_70), bVar1)) {
LAB_0021e309:
        bVar1 = false;
      }
      else {
        cmAlphaNum::cmAlphaNum(&local_c8,(string *)dir.Internal);
        cmAlphaNum::cmAlphaNum(&local_f8,'/');
        cmStrCat<std::__cxx11::string>
                  ((string *)local_98,&local_c8,&local_f8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
        cmsys::SystemTools::GetFilenameLastExtension(&local_118,(string *)local_98);
        bVar1 = std::operator==(&local_118,".mcov");
        std::__cxx11::string::~string((string *)&local_118);
        if (bVar1) {
          pcVar3 = (char *)std::__cxx11::string::c_str();
          bVar1 = ReadMCovFile(this,pcVar3);
          if (bVar1) goto LAB_0021e2dd;
          this_local._7_1_ = 0;
          bVar1 = true;
        }
        else {
LAB_0021e2dd:
          bVar1 = false;
        }
        std::__cxx11::string::~string((string *)local_98);
        if (!bVar1) goto LAB_0021e309;
      }
      std::__cxx11::string::~string((string *)local_70);
      if (bVar1) goto LAB_0021e348;
    }
    this_local._7_1_ = 1;
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0021e348:
  cmsys::Directory::~Directory(&local_28);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmParseGTMCoverage::LoadCoverageData(std::string const& d)
{
  // load all the .mcov files in the specified directory
  cmsys::Directory dir;
  if (!dir.Load(d)) {
    return false;
  }
  size_t numf;
  unsigned int i;
  numf = dir.GetNumberOfFiles();
  for (i = 0; i < numf; i++) {
    std::string file = dir.GetFile(i);
    if (file != "." && file != ".." && !cmSystemTools::FileIsDirectory(file)) {
      std::string path = cmStrCat(d, '/', file);
      if (cmSystemTools::GetFilenameLastExtension(path) == ".mcov") {
        if (!this->ReadMCovFile(path.c_str())) {
          return false;
        }
      }
    }
  }
  return true;
}